

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

ImRect GetResizeBorderRect(ImGuiWindow *window,int border_n,float perp_padding,float thickness)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  ImRect IVar7;
  
  IVar7 = ImGuiWindow::Rect(window);
  fVar2 = IVar7.Max.x;
  fVar4 = IVar7.Max.y;
  if ((thickness == 0.0) && (!NAN(thickness))) {
    fVar2 = fVar2 + -1.0;
    fVar4 = fVar4 + -1.0;
  }
  fVar5 = IVar7.Min.x;
  fVar1 = IVar7.Min.y;
  switch(border_n) {
  case 0:
    fVar5 = fVar5 + perp_padding;
    fVar6 = fVar1 - thickness;
    fVar3 = fVar2 - perp_padding;
    fVar4 = fVar1 + thickness;
    break;
  case 1:
    goto LAB_001c8e23;
  case 2:
    fVar5 = fVar5 + perp_padding;
    fVar6 = fVar4 - thickness;
    fVar3 = fVar2 - perp_padding;
    fVar4 = fVar4 + thickness;
    break;
  case 3:
    fVar2 = fVar5;
LAB_001c8e23:
    fVar6 = fVar1 + perp_padding;
    fVar4 = fVar4 - perp_padding;
    fVar3 = thickness + fVar2;
    fVar5 = fVar2 - thickness;
    break;
  default:
    fVar5 = 0.0;
    fVar6 = 0.0;
    fVar3 = 0.0;
    fVar4 = 0.0;
  }
  IVar7.Min.y = fVar6;
  IVar7.Min.x = fVar5;
  IVar7.Max.y = fVar4;
  IVar7.Max.x = fVar3;
  return IVar7;
}

Assistant:

static ImRect GetResizeBorderRect(ImGuiWindow* window, int border_n, float perp_padding, float thickness)
{
    ImRect rect = window->Rect();
    if (thickness == 0.0f) rect.Max -= ImVec2(1, 1);
    if (border_n == 0) { return ImRect(rect.Min.x + perp_padding, rect.Min.y - thickness,    rect.Max.x - perp_padding, rect.Min.y + thickness);    } // Top
    if (border_n == 1) { return ImRect(rect.Max.x - thickness,    rect.Min.y + perp_padding, rect.Max.x + thickness,    rect.Max.y - perp_padding); } // Right
    if (border_n == 2) { return ImRect(rect.Min.x + perp_padding, rect.Max.y - thickness,    rect.Max.x - perp_padding, rect.Max.y + thickness);    } // Bottom
    if (border_n == 3) { return ImRect(rect.Min.x - thickness,    rect.Min.y + perp_padding, rect.Min.x + thickness,    rect.Max.y - perp_padding); } // Left
    IM_ASSERT(0);
    return ImRect();
}